

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

bool __thiscall
moira::Moira::execDivlMusashi<(moira::Core)2,(moira::Instr)154,(moira::Mode)10,4>
          (Moira *this,u16 opcode,bool *divByZero)

{
  u32 uVar1;
  uint n;
  uint n_00;
  u32 uVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  u32 local_74;
  u32 uStack_70;
  pair<unsigned_int,_unsigned_int> result_3;
  pair<unsigned_int,_unsigned_int> result_2;
  pair<unsigned_int,_unsigned_int> result_1;
  pair<unsigned_int,_unsigned_int> result;
  int dl;
  int dh;
  int src;
  u16 ext;
  u32 divisor;
  u32 ea;
  u64 dividend;
  bool *divByZero_local;
  Moira *pMStack_18;
  u16 opcode_local;
  Moira *this_local;
  
  dividend = (u64)divByZero;
  divByZero_local._6_2_ = opcode;
  pMStack_18 = this;
  uVar1 = readI<(moira::Core)2,2>(this);
  n = uVar1 & 7;
  n_00 = (ushort)((ushort)uVar1 >> 0xc) & 7;
  readOp<(moira::Core)2,(moira::Mode)10,4,0ull>
            (this,divByZero_local._6_2_ & 7,(u32 *)&stack0xffffffffffffffcc,(u32 *)&src);
  if (src == 0) {
    execException<(moira::Core)2>(this,DIVIDE_BY_ZERO,0);
    *(undefined1 *)dividend = 1;
    this_local._7_1_ = false;
  }
  else {
    prefetch<(moira::Core)2,4ull>(this);
    switch((ushort)uVar1 >> 10 & 3) {
    case 0:
      uVar1 = readD<4>(this,n_00);
      _divisor = (ulong)uVar1;
      pVar3 = divluMusashi<2>(this,_divisor,src);
      result_1.second = pVar3.second;
      writeD<4>(this,n,result_1.second);
      result_1.first = pVar3.first;
      writeD<4>(this,n_00,result_1.first);
      break;
    case 1:
      uVar1 = readD<4>(this,n);
      uVar2 = readD<4>(this,n_00);
      _divisor = CONCAT44(uVar1,uVar2);
      pVar3 = divluMusashi<4>(this,_divisor,src);
      if (((this->reg).sr.v & 1U) == 0) {
        result_2.second = pVar3.second;
        writeD<4>(this,n,result_2.second);
        result_2.first = pVar3.first;
        writeD<4>(this,n_00,result_2.first);
      }
      break;
    case 2:
      uVar1 = readD<4>(this,n_00);
      _divisor = (ulong)uVar1;
      pVar3 = divlsMusashi<2>(this,_divisor,src);
      result_3.second = pVar3.second;
      writeD<4>(this,n,result_3.second);
      result_3.first = pVar3.first;
      writeD<4>(this,n_00,result_3.first);
      break;
    case 3:
      uVar1 = readD<4>(this,n);
      uVar2 = readD<4>(this,n_00);
      _divisor = CONCAT44(uVar1,uVar2);
      pVar3 = divlsMusashi<4>(this,_divisor,src);
      if (((this->reg).sr.v & 1U) == 0) {
        uStack_70 = pVar3.second;
        writeD<4>(this,n,uStack_70);
        local_74 = pVar3.first;
        writeD<4>(this,n_00,local_74);
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Moira::execDivlMusashi(u16 opcode, bool *divByZero)
{
    u64 dividend;
    u32 ea, divisor;
    u16 ext = (u16)readI<C, Word>();

    int src = _____________xxx(opcode);
    int dh  = _____________xxx(ext);
    int dl  = _xxx____________(ext);

    try {
        readOp<C, M, S>(src, &ea, &divisor);
    } catch(...) {
        // TODO: Change return type from bool to void
        return false;
    }

    if (divisor == 0) {

        execException<C>(M68kException::DIVIDE_BY_ZERO);
        *divByZero = true;
        return false;
    }

    prefetch<C, POLL>();

    switch (____xx__________(ext)) {

        case 0b00:
        {
            dividend = readD(dl);

            auto result = divluMusashi<Word>(dividend, divisor);
            writeD(dh, result.second);
            writeD(dl, result.first);
            break;
        }
        case 0b01:
        {
            dividend = (u64)readD(dh) << 32 | readD(dl);
            auto result = divluMusashi<Long>(dividend, divisor);
            if(!reg.sr.v) {

                writeD(dh, result.second);
                writeD(dl, result.first);
            }
            break;
        }
        case 0b10:
        {
            dividend = readD(dl);
            auto result = divlsMusashi<Word>(dividend, divisor);
            writeD(dh, result.second);
            writeD(dl, result.first);
            break;
        }
        case 0b11:
        {
            dividend = (u64)readD(dh) << 32 | readD(dl);
            auto result = divlsMusashi<Long>(dividend, divisor);

            if(!reg.sr.v) {

                writeD(dh, result.second);
                writeD(dl, result.first);
            }
            break;
        }
    }

    return true;
}